

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_parseSettingsLine
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *line,int lineNumber)

{
  Verbosity VVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *in_RSI;
  long in_RDI;
  bool bVar6;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  unsigned_long parseval;
  uint value_2;
  Verbosity old_verbosity_10;
  Real value_1;
  Verbosity old_verbosity_9;
  int local_res100;
  Verbosity old_verbosity_8;
  int value;
  Verbosity old_verbosity_7;
  int local_res150;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  int param;
  Verbosity old_verbosity_4;
  char *paramValueString;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  char *paramName;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  char *paramTypeString;
  bool success;
  size_t *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffeb2;
  undefined1 in_stack_fffffffffffffeb3;
  Verbosity in_stack_fffffffffffffeb4;
  Verbosity in_stack_fffffffffffffeb8;
  Verbosity in_stack_fffffffffffffebc;
  Verbosity local_140 [3];
  allocator local_131;
  string local_130 [32];
  char *local_110;
  undefined4 local_108;
  Verbosity in_stack_fffffffffffffefc;
  undefined1 init;
  Verbosity in_stack_ffffffffffffff00;
  IntParam in_stack_ffffffffffffff04;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff17;
  Real in_stack_ffffffffffffff18;
  RealParam in_stack_ffffffffffffff24;
  Verbosity local_d0;
  Verbosity local_cc;
  int local_c8;
  Verbosity local_c4;
  Verbosity local_c0 [5];
  allocator local_a9;
  string local_a8 [36];
  int local_84;
  Verbosity local_80;
  Verbosity local_7c;
  int local_78;
  Verbosity local_74;
  Verbosity local_70 [3];
  int local_64;
  Verbosity local_60;
  Verbosity local_5c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  Verbosity local_50;
  Verbosity local_4c [3];
  char *local_40;
  Verbosity local_38;
  Verbosity local_34 [3];
  char *local_28;
  bool local_1d;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_18;
  bool local_1;
  
  local_1d = true;
  local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_RSI;
  while( true ) {
    pSVar7 = local_18;
    bVar6 = true;
    if ((*(char *)local_18 != ' ') && (bVar6 = true, *(char *)local_18 != '\t')) {
      bVar6 = *(char *)local_18 == '\r';
    }
    if (!bVar6) break;
    local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((long)local_18 + 1);
  }
  if (((*(char *)local_18 == '\0') || (*(char *)local_18 == '\n')) || (*(char *)local_18 == '#')) {
    local_1 = true;
  }
  else {
    local_28 = (char *)local_18;
    while( true ) {
      bVar6 = false;
      if ((((*(char *)local_18 != ' ') && (bVar6 = false, *(char *)local_18 != '\t')) &&
          ((bVar6 = false, *(char *)local_18 != '\r' &&
           ((bVar6 = false, *(char *)local_18 != '\n' && (bVar6 = false, *(char *)local_18 != '#')))
           ))) && (bVar6 = false, *(char *)local_18 != '\0')) {
        bVar6 = *(char *)local_18 != ':';
      }
      if (!bVar6) break;
      local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((long)local_18 + 1);
    }
    if (*(char *)local_18 == ':') {
      *(char *)local_18 = '\0';
      local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((long)local_18 + 1);
    }
    else {
      *(char *)local_18 = '\0';
      do {
        pcVar5 = (char *)local_18;
        local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(pcVar5 + 1);
        bVar6 = true;
        if ((*(char *)local_18 != ' ') && (bVar6 = true, *(char *)local_18 != '\t')) {
          bVar6 = *(char *)local_18 == '\r';
        }
      } while (bVar6);
      if (*(char *)local_18 != ':') {
        if ((in_RDI != -8) && (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)
           ) {
          local_34[2] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
          local_34[1] = 3;
          SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_34 + 1);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_34 + 2);
        }
        return false;
      }
      local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(pcVar5 + 2);
    }
    while( true ) {
      bVar6 = true;
      if ((*(char *)local_18 != ' ') && (bVar6 = true, *(char *)local_18 != '\t')) {
        bVar6 = *(char *)local_18 == '\r';
      }
      if (!bVar6) break;
      local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((long)local_18 + 1);
    }
    if (((*(char *)local_18 == '\0') || (*(char *)local_18 == '\n')) || (*(char *)local_18 == '#'))
    {
      if ((in_RDI != -8) && (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1))
      {
        local_34[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
        local_38 = INFO1;
        SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_38);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                           (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_34);
      }
      local_1 = false;
    }
    else {
      local_40 = (char *)local_18;
      while( true ) {
        bVar6 = false;
        if (((*(char *)local_18 != ' ') && (bVar6 = false, *(char *)local_18 != '\t')) &&
           ((bVar6 = false, *(char *)local_18 != '\r' &&
            (((bVar6 = false, *(char *)local_18 != '\n' && (bVar6 = false, *(char *)local_18 != '#')
              ) && (bVar6 = false, *(char *)local_18 != '\0')))))) {
          bVar6 = *(char *)local_18 != '=';
        }
        if (!bVar6) break;
        local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)local_18 + 1);
      }
      if (*(char *)local_18 == '=') {
        *(char *)local_18 = '\0';
        local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)local_18 + 1);
      }
      else {
        *(char *)local_18 = '\0';
        do {
          pcVar5 = (char *)local_18;
          local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(pcVar5 + 1);
          bVar6 = true;
          if ((*(char *)local_18 != ' ') && (bVar6 = true, *(char *)local_18 != '\t')) {
            bVar6 = *(char *)local_18 == '\r';
          }
        } while (bVar6);
        if (*(char *)local_18 != '=') {
          if ((in_RDI != -8) &&
             (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
            local_4c[2] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
            local_4c[1] = 3;
            SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_4c + 1);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_4c + 2);
          }
          return false;
        }
        local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(pcVar5 + 2);
      }
      while( true ) {
        bVar6 = true;
        if ((*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
           (bVar6 = true, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x9)) {
          bVar6 = *(_Alloc_hider *)&local_18->_vptr_SoPlexBase == (_Alloc_hider)0xd;
        }
        if (!bVar6) break;
        local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((_Alloc_hider *)&local_18->_vptr_SoPlexBase + 1);
      }
      if (((*(_Alloc_hider *)&local_18->_vptr_SoPlexBase == (_Alloc_hider)0x0) ||
          (*(_Alloc_hider *)&local_18->_vptr_SoPlexBase == (_Alloc_hider)0xa)) ||
         (*(_Alloc_hider *)&local_18->_vptr_SoPlexBase == (_Alloc_hider)0x23)) {
        if ((in_RDI != -8) && (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)
           ) {
          local_4c[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
          local_50 = INFO1;
          SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_50);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_4c);
        }
        local_1 = false;
      }
      else {
        local_58 = local_18;
        while( true ) {
          bVar6 = false;
          if (((*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
              (bVar6 = false, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x9)) &&
             ((bVar6 = false, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0xd &&
              ((bVar6 = false, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0xa &&
               (bVar6 = false, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x23)))
              ))) {
            bVar6 = *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x0;
          }
          if (!bVar6) break;
          local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((_Alloc_hider *)&local_18->_vptr_SoPlexBase + 1);
        }
        if (*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x0) {
          *(_Alloc_hider *)&local_18->_vptr_SoPlexBase = (_Alloc_hider)0x0;
          do {
            local_18 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)((_Alloc_hider *)&local_18->_vptr_SoPlexBase + 1);
            bVar6 = true;
            if ((*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
               (bVar6 = true, *(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x9)) {
              bVar6 = *(_Alloc_hider *)&local_18->_vptr_SoPlexBase == (_Alloc_hider)0xd;
            }
          } while (bVar6);
          if (((*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x0) &&
              (*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0xa)) &&
             (*(_Alloc_hider *)&local_18->_vptr_SoPlexBase != (_Alloc_hider)0x23)) {
            if ((in_RDI != -8) &&
               (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
              local_5c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
              local_60 = INFO1;
              SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_60);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char)((ulong)in_stack_fffffffffffffe38 >> 0x38));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_5c);
            }
            return false;
          }
        }
        iVar2 = strncmp((char *)pSVar7,"bool",4);
        if (iVar2 == 0) {
          for (local_64 = 0; pcVar5 = local_40, local_64 < 0x1a; local_64 = local_64 + 1) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = strncmp(pcVar5,pcVar3,500);
            if (iVar2 == 0) {
              iVar2 = strncasecmp((char *)local_58,"true",4);
              if ((((iVar2 == 0) || (iVar2 = strncasecmp((char *)local_58,"TRUE",4), iVar2 == 0)) ||
                  (iVar2 = strncasecmp((char *)local_58,"t",4), iVar2 == 0)) ||
                 ((iVar2 = strncasecmp((char *)local_58,"T",4), iVar2 == 0 ||
                  (lVar4 = strtol((char *)local_58,(char **)0x0,4), lVar4 == 1)))) {
                local_1d = setBoolParam((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_fffffffffffffebc,
                                                    in_stack_fffffffffffffeb8),
                                        in_stack_fffffffffffffeb4,(bool)in_stack_fffffffffffffeb3,
                                        (bool)in_stack_fffffffffffffeb2);
              }
              else {
                iVar2 = strncasecmp((char *)local_58,"false",5);
                if (((iVar2 == 0) || (iVar2 = strncasecmp((char *)local_58,"FALSE",5), iVar2 == 0))
                   || ((iVar2 = strncasecmp((char *)local_58,"f",5), iVar2 == 0 ||
                       ((iVar2 = strncasecmp((char *)local_58,"F",5), iVar2 == 0 ||
                        (lVar4 = strtol((char *)local_58,(char **)0x0,5), lVar4 == 0)))))) {
                  local_1d = setBoolParam((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_fffffffffffffebc,
                                                      in_stack_fffffffffffffeb8),
                                          in_stack_fffffffffffffeb4,(bool)in_stack_fffffffffffffeb3,
                                          (bool)in_stack_fffffffffffffeb2);
                }
                else {
                  local_1d = false;
                }
              }
              if (local_1d != false) {
                return true;
              }
              if ((in_RDI != -8) &&
                 (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                local_70[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                local_74 = INFO1;
                SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_74);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_70);
              }
              return false;
            }
          }
          if ((in_RDI != -8) &&
             (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
            local_70[2] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
            local_70[1] = 3;
            SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_70 + 1);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38
                              );
            SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_70 + 2);
          }
          local_1 = false;
        }
        else {
          iVar2 = strncmp(local_28,"int",3);
          if (iVar2 == 0) {
            for (local_78 = 0; pcVar5 = local_40, local_78 < 0x1c; local_78 = local_78 + 1) {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = strncmp(pcVar5,pcVar3,500);
              pSVar7 = local_58;
              init = (undefined1)(in_stack_fffffffffffffefc >> 0x18);
              if (iVar2 == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a8,(char *)pSVar7,&local_a9);
                local_84 = std::__cxx11::stoi(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0)
                ;
                std::__cxx11::string::~string(local_a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_a9);
                bVar6 = setIntParam(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                                    in_stack_ffffffffffffff00,(bool)init);
                if (!bVar6) {
                  if ((in_RDI != -8) &&
                     (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                    local_c0[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                    local_c4 = INFO1;
                    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_c4);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_c0);
                  }
                  return false;
                }
                return true;
              }
            }
            if ((in_RDI != -8) &&
               (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
              local_7c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
              local_80 = INFO1;
              SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_80);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                 (char *)in_stack_fffffffffffffe38);
              SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_7c);
            }
            local_1 = false;
          }
          else {
            iVar2 = strncmp(local_28,"real",4);
            if (iVar2 == 0) {
              for (local_c8 = 0; pcVar5 = local_40, local_c8 < 0x1b; local_c8 = local_c8 + 1) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = strncmp(pcVar5,pcVar3,500);
                pSVar7 = local_58;
                if (iVar2 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&stack0xffffffffffffff08,(char *)pSVar7,
                             (allocator *)&stack0xffffffffffffff07);
                  pSVar7 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)std::__cxx11::stod(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                                                );
                  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
                  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
                  bVar6 = setRealParam(pSVar7,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                                       (bool)in_stack_ffffffffffffff17);
                  if (!bVar6) {
                    if ((in_RDI != -8) &&
                       (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                      SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                      SPxOut::setVerbosity
                                ((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffefc);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                         (char *)in_stack_fffffffffffffe38);
                      SPxOut::setVerbosity
                                ((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xffffffffffffff00);
                    }
                    return false;
                  }
                  return true;
                }
              }
              if ((in_RDI != -8) &&
                 (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                local_cc = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                local_d0 = INFO1;
                SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_d0);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                   (char *)in_stack_fffffffffffffe38);
                SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_cc);
              }
              local_1 = false;
            }
            else {
              iVar2 = strncmp(local_28,"uint",4);
              if (iVar2 == 0) {
                iVar2 = strncmp(local_40,"random_seed",0xb);
                if (iVar2 == 0) {
                  pSVar7 = local_58;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_130,(char *)pSVar7,&local_131);
                  pcVar5 = (char *)std::__cxx11::stoul((string *)pSVar7,in_stack_fffffffffffffe38,0)
                  ;
                  local_110 = pcVar5;
                  std::__cxx11::string::~string(local_130);
                  std::allocator<char>::~allocator((allocator<char> *)&local_131);
                  if (local_110 < (char *)0x100000000) {
                    local_108 = SUB84(local_110,0);
                  }
                  else {
                    local_108 = 0xffffffff;
                    if ((in_RDI != -8) &&
                       (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 0 < (int)VVar1)) {
                      local_140[2] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                      local_140[1] = 1;
                      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_140 + 1);
                      soplex::operator<<((SPxOut *)pSVar7,pcVar5);
                      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_140 + 2);
                    }
                  }
                  setRandomSeed(pSVar7,(uint)((ulong)pcVar5 >> 0x20));
                  local_1 = true;
                }
                else {
                  if ((in_RDI != -8) &&
                     (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                    local_140[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                    SPxOut::setVerbosity
                              ((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffebc);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                       (char *)in_stack_fffffffffffffe38);
                    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_140);
                  }
                  local_1 = false;
                }
              }
              else {
                if ((in_RDI != -8) &&
                   (VVar1 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar1)) {
                  SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
                  SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffeb4)
                  ;
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe40,
                                     (char *)in_stack_fffffffffffffe38);
                  SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffeb8)
                  ;
                }
                local_1 = false;
              }
            }
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::_parseSettingsLine(char* line, const int lineNumber)
{
   assert(line != nullptr);

   bool success = true;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing settings file: no ':' separating parameter type and name in line " << lineNumber <<
                       ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter name in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no '=' after parameter name in line "
                       << lineNumber << ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter value in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: additional character '" << *line <<
                       "' after parameter value in line " << lineNumber << ".\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a R parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;

#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for R parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << "> in line " << lineNumber << ".\n");

   return false;
}